

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O2

int fbackupfile(char *fn)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t __n;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  char cVar10;
  char local_2168 [8];
  char buf [8192];
  timespec new_times [2];
  undefined1 local_d0 [8];
  stat sb;
  char *tname;
  char *nname;
  
  iVar3 = stat(fn,(stat *)local_d0);
  if (iVar3 == -1) {
    dobeep();
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    ewprintf("Can\'t stat %s : %s",fn,pcVar8);
    return 0;
  }
  if ((((bkupdir == (char *)0x0) || (iVar3 = stat(bkupdir,(stat *)(buf + 0x1ff8)), iVar3 != 0)) ||
      (((uint)new_times[1].tv_sec & 0xf000) != 0x4000)) ||
     ((leavetmp != 0 && (iVar3 = strncmp(fn,"/tmp",4), iVar3 == 0)))) {
    pcVar8 = strndup(fn,0x400);
  }
  else {
    pcVar8 = bkupdir;
    sVar5 = strlen(bkupdir);
    iVar3 = 0;
    pcVar9 = fn;
    while( true ) {
      cVar1 = *pcVar9;
      if (cVar1 == '\0') break;
      if (0x3ff - (int)sVar5 <= iVar3) {
        return 0;
      }
      cVar10 = '!';
      if ((cVar1 != '/') && (cVar10 = cVar1, cVar1 == '!')) {
        if (0x3fe - (int)sVar5 <= iVar3) {
          return 0;
        }
        local_2168[iVar3] = '!';
        iVar3 = iVar3 + 1;
        cVar10 = '!';
      }
      local_2168[iVar3] = cVar10;
      iVar3 = iVar3 + 1;
      pcVar9 = pcVar9 + 1;
    }
    local_2168[iVar3] = '\0';
    iVar3 = asprintf(&tname,"%s/%s",pcVar8,local_2168);
    pcVar8 = tname;
    if (iVar3 == -1) {
      return 0;
    }
  }
  if (pcVar8 == (char *)0x0) {
    return 0;
  }
  iVar3 = asprintf(&tname,"%s~",pcVar8);
  if (iVar3 == -1) {
    dobeep();
    piVar7 = __errno_location();
    pcVar9 = strerror(*piVar7);
    ewprintf("Can\'t allocate backup file name : %s",pcVar9);
  }
  else {
    iVar3 = asprintf((char **)(sb.__glibc_reserved + 2),"%s.XXXXXXXXXX",pcVar8);
    if (iVar3 != -1) {
      free(pcVar8);
      iVar3 = open(fn,0);
      if (iVar3 == -1) {
        free(tname);
        free((void *)sb.__glibc_reserved[2]);
        return 0;
      }
      iVar4 = mkstemp((char *)sb.__glibc_reserved[2]);
      if (iVar4 == -1) {
        piVar7 = __errno_location();
        iVar4 = *piVar7;
        close(iVar3);
        free(tname);
        free((void *)sb.__glibc_reserved[2]);
        *piVar7 = iVar4;
        return 0;
      }
      do {
        __n = read(iVar3,local_2168,0x2000);
        sVar5 = __n;
        if ((long)__n < 1) break;
        sVar6 = write(iVar4,local_2168,__n);
        sVar5 = 0xffffffffffffffff;
      } while (sVar6 == __n);
      piVar7 = __errno_location();
      iVar2 = *piVar7;
      fchmod(iVar4,(uint)sb.st_nlink & 0x1ff);
      buf[0x1ff8] = (undefined1)sb.st_blocks;
      buf[0x1ff9] = sb.st_blocks._1_1_;
      buf[0x1ffa] = sb.st_blocks._2_1_;
      buf[0x1ffb] = sb.st_blocks._3_1_;
      buf[0x1ffc] = sb.st_blocks._4_1_;
      buf[0x1ffd] = sb.st_blocks._5_1_;
      buf[0x1ffe] = sb.st_blocks._6_1_;
      buf[0x1fff] = sb.st_blocks._7_1_;
      futimens(iVar4,(timespec *)(buf + 0x1ff8));
      close(iVar3);
      close(iVar4);
      if (sVar5 == 0xffffffffffffffff) {
        iVar4 = unlink((char *)sb.__glibc_reserved[2]);
        iVar3 = 0;
        if (iVar4 == -1) {
          pcVar8 = strerror(*piVar7);
          iVar3 = 0;
          ewprintf("Can\'t unlink temp : %s",pcVar8);
        }
      }
      else {
        iVar3 = rename((char *)sb.__glibc_reserved[2],tname);
        if (iVar3 == -1) {
          pcVar8 = strerror(*piVar7);
          iVar3 = 0;
          ewprintf("Can\'t rename temp : %s",pcVar8);
          unlink((char *)sb.__glibc_reserved[2]);
        }
        else {
          iVar3 = 1;
        }
      }
      free(tname);
      free((void *)sb.__glibc_reserved[2]);
      *piVar7 = iVar2;
      return iVar3;
    }
    dobeep();
    piVar7 = __errno_location();
    pcVar9 = strerror(*piVar7);
    ewprintf("Can\'t allocate temp file name : %s",pcVar9);
    free(pcVar8);
    pcVar8 = tname;
  }
  free(pcVar8);
  return 2;
}

Assistant:

int
fbackupfile(const char *fn)
{
	struct stat	 sb;
	struct timespec	 new_times[2];
	int		 from, to, serrno;
	ssize_t		 nread;
	char		 buf[BUFSIZ];
	char		*nname, *tname, *bkpth;

	if (stat(fn, &sb) == -1) {
		dobeep();
		ewprintf("Can't stat %s : %s", fn, strerror(errno));
		return (FALSE);
	}

	if ((bkpth = bkuplocation(fn)) == NULL)
		return (FALSE);

	if (asprintf(&nname, "%s~", bkpth) == -1) {
		dobeep();
		ewprintf("Can't allocate backup file name : %s", strerror(errno));
		free(bkpth);
		return (ABORT);
	}
	if (asprintf(&tname, "%s.XXXXXXXXXX", bkpth) == -1) {
		dobeep();
		ewprintf("Can't allocate temp file name : %s", strerror(errno));
		free(bkpth);
		free(nname);
		return (ABORT);
	}
	free(bkpth);

	if ((from = open(fn, O_RDONLY)) == -1) {
		free(nname);
		free(tname);
		return (FALSE);
	}
	to = mkstemp(tname);
	if (to == -1) {
		serrno = errno;
		close(from);
		free(nname);
		free(tname);
		errno = serrno;
		return (FALSE);
	}
	while ((nread = read(from, buf, sizeof(buf))) > 0) {
		if (write(to, buf, (size_t)nread) != nread) {
			nread = -1;
			break;
		}
	}
	serrno = errno;
	(void) fchmod(to, (sb.st_mode & 0777));

	/* copy the mtime to the backupfile */
	new_times[0] = sb.st_atim;
	new_times[1] = sb.st_mtim;
	futimens(to, new_times);

	close(from);
	close(to);
	if (nread == -1) {
		if (unlink(tname) == -1)
			ewprintf("Can't unlink temp : %s", strerror(errno));
	} else {
		if (rename(tname, nname) == -1) {
			ewprintf("Can't rename temp : %s", strerror(errno));
			(void) unlink(tname);
			nread = -1;
		}
	}
	free(nname);
	free(tname);
	errno = serrno;

	return (nread == -1 ? FALSE : TRUE);
}